

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_benchmark.cpp
# Opt level: O0

void __thiscall tst_benchmark::errorThen(tst_benchmark *this)

{
  Logs *pLVar1;
  ulong uVar2;
  undefined1 local_b4 [20];
  QPromiseBase<void> local_a0;
  QPromiseBase<void> local_90;
  QPromiseBase<void> local_80;
  int local_6c;
  int *piStack_68;
  int value_1;
  undefined1 local_4c [4];
  QPromiseBase<void> local_48;
  QPromiseBase<void> local_38;
  QPromiseBase<void> local_28;
  int local_14;
  tst_benchmark *ptStack_10;
  int value;
  tst_benchmark *this_local;
  
  local_14 = -1;
  ptStack_10 = this;
  pLVar1 = Logger::logs();
  Logs::reset(pLVar1);
  Data::Data((Data *)local_4c,0x2a);
  QtPromise::QPromiseBase<void>::reject<Data>
            ((QPromiseBase<void> *)(local_4c + 4),(Data_conflict *)local_4c);
  piStack_68 = &local_14;
  QtPromise::QPromiseBase<void>::fail<tst_benchmark::errorThen()::__0>
            (&local_38,(anon_class_8_1_a8c68091 *)(local_4c + 4));
  QtPromise::QPromiseBase<void>::wait(&local_28,&local_38);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_28);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_38);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)(local_4c + 4));
  Data::~Data((Data *)local_4c);
  pLVar1 = Logger::logs();
  uVar2 = QTest::qCompare(pLVar1->ctor,1,"Data::logs().ctor","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0x12a);
  if ((uVar2 & 1) != 0) {
    pLVar1 = Logger::logs();
    uVar2 = QTest::qCompare(pLVar1->copy,1,"Data::logs().copy","1 + 2 * EXCEPT_CALL_COPY_CTOR",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                            ,300);
    if ((uVar2 & 1) != 0) {
      pLVar1 = Logger::logs();
      uVar2 = QTest::qCompare(pLVar1->move,0,"Data::logs().move","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                              ,0x12d);
      if ((uVar2 & 1) != 0) {
        pLVar1 = Logger::logs();
        uVar2 = QTest::qCompare(pLVar1->refs,0,"Data::logs().refs","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                ,0x12e);
        if (((uVar2 & 1) != 0) &&
           (uVar2 = QTest::qCompare(local_14,0x2a,"value","42",
                                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                    ,0x12f), (uVar2 & 1) != 0)) {
          local_6c = -1;
          pLVar1 = Logger::logs();
          Logs::reset(pLVar1);
          Data::Data((Data *)local_b4,0x2a);
          QtPromise::QPromiseBase<void>::reject<Data>
                    ((QPromiseBase<void> *)(local_b4 + 4),(Data_conflict *)local_b4);
          QtPromise::QPromiseBase<void>::fail<tst_benchmark::errorThen()::__1>
                    (&local_a0,(anon_class_1_0_00000001 *)(local_b4 + 4));
          QtPromise::QPromiseBase<void>::fail<tst_benchmark::errorThen()::__2>
                    (&local_90,(anon_class_8_1_a8c68091 *)&local_a0);
          QtPromise::QPromiseBase<void>::wait(&local_80,&local_90);
          QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_80);
          QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_90);
          QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_a0);
          QtPromise::QPromise<void>::~QPromise((QPromise<void> *)(local_b4 + 4));
          Data::~Data((Data *)local_b4);
          pLVar1 = Logger::logs();
          uVar2 = QTest::qCompare(pLVar1->ctor,1,"Data::logs().ctor","1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                  ,0x13d);
          if ((uVar2 & 1) != 0) {
            pLVar1 = Logger::logs();
            uVar2 = QTest::qCompare(pLVar1->copy,1,"Data::logs().copy",
                                    "1 + 4 * EXCEPT_CALL_COPY_CTOR",
                                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                    ,0x13f);
            if ((uVar2 & 1) != 0) {
              pLVar1 = Logger::logs();
              uVar2 = QTest::qCompare(pLVar1->move,0,"Data::logs().move","0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                      ,0x140);
              if ((uVar2 & 1) != 0) {
                pLVar1 = Logger::logs();
                uVar2 = QTest::qCompare(pLVar1->refs,0,"Data::logs().refs","0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                        ,0x141);
                if ((uVar2 & 1) != 0) {
                  QTest::qCompare(local_6c,0x2a,"value","42",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                  ,0x142);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void tst_benchmark::errorThen()
{
    { // should not copy error on continuation if rejected
        int value = -1;
        Data::logs().reset();
        QtPromise::QPromise<void>::reject(Data{42})
            .fail([&](const Data& res) {
                value = res.value();
            })
            .wait();

        QCOMPARE(Data::logs().ctor, 1);
        QCOMPARE(Data::logs().copy,
                 1 + 2 * EXCEPT_CALL_COPY_CTOR); // (initial) copy value in std::exception_ptr
        QCOMPARE(Data::logs().move, 0);
        QCOMPARE(Data::logs().refs, 0);
        QCOMPARE(value, 42);
    }
    { // should not copy error on continuation if rethrown
        int value = -1;
        Data::logs().reset();
        QtPromise::QPromise<void>::reject(Data{42})
            .fail([](const Data&) {
                throw;
            })
            .fail([&](const Data& res) {
                value = res.value();
            })
            .wait();

        QCOMPARE(Data::logs().ctor, 1);
        QCOMPARE(Data::logs().copy,
                 1 + 4 * EXCEPT_CALL_COPY_CTOR); // (initial) copy value in std::exception_ptr
        QCOMPARE(Data::logs().move, 0);
        QCOMPARE(Data::logs().refs, 0);
        QCOMPARE(value, 42);
    }
}